

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

QAction * __thiscall
QMenuPrivate::exec(QMenuPrivate *this,QPoint *p,QAction *action,PositionFunction positionFunction)

{
  QWidget *this_00;
  PositionFunction positionFunction_00;
  function<QPoint_(const_QSize_&)> *in_RCX;
  QAction *pQVar1;
  long in_FS_OFFSET;
  Data *in_stack_ffffffffffffff88;
  Data *pDVar2;
  QObject *in_stack_ffffffffffffff90;
  QObject *pQVar3;
  _Any_data in_stack_ffffffffffffff98;
  _Manager_type local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QWidget::ensurePolished(this_00);
  QWidget::createWinId(this_00);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEventLoop::QEventLoop((QEventLoop *)&local_48,(QObject *)0x0);
  this->eventLoop = (QEventLoop *)&local_48;
  std::function<QPoint_(const_QSize_&)>::function
            ((function<QPoint_(const_QSize_&)> *)&stack0xffffffffffffff98,in_RCX);
  positionFunction_00.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff90;
  positionFunction_00.super__Function_base._M_functor._M_unused._M_object =
       in_stack_ffffffffffffff88;
  positionFunction_00._16_16_ = in_stack_ffffffffffffff98;
  popup(this,p,action,positionFunction_00);
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)((_Any_data *)&stack0xffffffffffffff98,(_Any_data *)&stack0xffffffffffffff98,
                __destroy_functor);
  }
  pDVar2 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  QPointer<QObject>::QPointer<void>
            ((QPointer<QObject> *)&stack0xffffffffffffff88,&this_00->super_QObject);
  if (this->eventLoop != (QEventLoop *)0x0) {
    QEventLoop::exec();
  }
  if (pDVar2 == (Data *)0x0) {
    pQVar1 = (QAction *)0x0;
  }
  else {
    pQVar1 = (QAction *)0x0;
    if ((*(int *)(pDVar2 + 4) != 0) && (pQVar3 != (QObject *)0x0)) {
      pDVar2 = (this->syncAction).wp.d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        pQVar1 = (QAction *)0x0;
      }
      else {
        pQVar1 = (QAction *)(this->syncAction).wp.value;
      }
      QWeakPointer<QObject>::assign<QObject>(&(this->syncAction).wp,(QObject *)0x0);
      this->eventLoop = (QEventLoop *)0x0;
      QWeakPointer<QObject>::clear(&(this->popupScreen).wp);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&stack0xffffffffffffff88);
  QEventLoop::~QEventLoop((QEventLoop *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QAction *QMenuPrivate::exec(const QPoint &p, QAction *action, PositionFunction positionFunction)
{
    Q_Q(QMenu);
    q->ensurePolished();
    q->createWinId();
    QEventLoop evtLoop;
    eventLoop = &evtLoop;
    popup(p, action, positionFunction);

    QPointer<QObject> guard = q;
    if (eventLoop) // popup might have reset if there was nothing to show
        (void)eventLoop->exec();
    if (guard.isNull())
        return nullptr;

    action = syncAction;
    syncAction = nullptr;
    eventLoop = nullptr;
    popupScreen.clear();
    return action;
}